

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring.h
# Opt level: O2

int equal_case(CBS *a,CBS *b)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  uVar5 = 0;
  if (a->len == b->len) {
    puVar1 = a->data;
    puVar2 = b->data;
    uVar4 = 0;
    do {
      uVar8 = uVar4;
      uVar3 = a->len;
      if (uVar3 <= uVar8) break;
      iVar6 = OPENSSL_tolower((uint)puVar1[uVar8]);
      iVar7 = OPENSSL_tolower((uint)puVar2[uVar8]);
      uVar4 = uVar8 + 1;
    } while (iVar6 == iVar7);
    uVar5 = (uint)(uVar3 <= uVar8);
  }
  return uVar5;
}

Assistant:

OPENSSL_INLINE size_t CBS_len(const CBS *cbs) { return cbs->len; }